

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void tests::to_dot(void)

{
  pointer ppNVar1;
  NS *pNVar2;
  N *this;
  N *this_00;
  N *pNVar3;
  N *this_01;
  N *this_02;
  N *this_03;
  N *this_04;
  int __fd;
  set<N_*,_std::less<N_*>,_std::allocator<N_*>_> viewed;
  _Any_data local_e8;
  code *local_d8;
  NS *local_c8;
  N *local_c0;
  N *local_b8;
  N *local_b0;
  N *local_a8;
  N *local_a0;
  undefined1 local_98 [8];
  _Rb_tree_node_base local_90;
  size_t local_70;
  vector<N_*,_std::allocator<N_*>_> local_68;
  vector<N_*,_std::allocator<N_*>_> local_48;
  
  pNVar2 = (NS *)operator_new(0x18);
  (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this,"p");
  local_a0 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(local_a0,"has instance");
  this_00 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_00,"p1");
  pNVar3 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(pNVar3,"p2");
  this_01 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_01,"A");
  local_a8 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(local_a8,"B");
  local_b0 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(local_b0,"C");
  this_02 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_02,"D");
  local_b8 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(local_b8,"BA");
  this_03 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_03,"BB");
  local_c8 = pNVar2;
  this_04 = (N *)N::operator_new(0x78,pNVar2);
  N::N<char_const*>(this_04,"BBB");
  local_c0 = pNVar3;
  local_98 = (undefined1  [8])this_00;
  local_90._0_8_ = pNVar3;
  N::connect(this,(int)local_a0,(sockaddr *)local_98,2);
  local_98 = (undefined1  [8])this_02;
  N::connect(this_01,(int)pNVar3,(sockaddr *)local_98,1);
  pNVar3 = local_a8;
  local_98 = (undefined1  [8])local_a8;
  local_90._0_8_ = local_b0;
  __fd = (int)this_00;
  N::connect(this_01,__fd,(sockaddr *)local_98,2);
  local_98 = (undefined1  [8])local_b8;
  local_90._0_8_ = this_03;
  N::connect(pNVar3,__fd,(sockaddr *)local_98,2);
  local_98 = (undefined1  [8])this_04;
  N::connect(this_03,__fd,(sockaddr *)local_98,1);
  local_98 = (undefined1  [8])this_04;
  N::connect(this_03,(int)local_c0,(sockaddr *)local_98,1);
  local_98 = (undefined1  [8])pNVar3;
  N::connect(this_04,__fd,(sockaddr *)local_98,1);
  local_90._M_left = &local_90;
  local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
  local_90._M_parent = (_Base_ptr)0x0;
  local_70 = 0;
  local_90._M_right = local_90._M_left;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"digraph T {",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  alg::dot((ostream *)&std::cout,(set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)local_98);
  local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  N::histo(this_01,(Alg<void> *)&local_e8,&local_48);
  if (local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  alg::dot((ostream *)&std::cout,(set<N_*,_std::less<N_*>,_std::allocator<N_*>_> *)local_98);
  local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  N::histo(this,(Alg<void> *)&local_e8,&local_68);
  if (local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  pNVar2 = NS::clear(local_c8);
  if ((pNVar2 != (NS *)0x0) &&
     (ppNVar1 = (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                super__Vector_impl_data._M_start, ppNVar1 != (pointer)0x0)) {
    operator_delete(ppNVar1,(long)(pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar1)
    ;
  }
  operator_delete(pNVar2,0x18);
  std::_Rb_tree<N_*,_N_*,_std::_Identity<N_*>,_std::less<N_*>,_std::allocator<N_*>_>::~_Rb_tree
            ((_Rb_tree<N_*,_N_*,_std::_Identity<N_*>,_std::less<N_*>,_std::allocator<N_*>_> *)
             local_98);
  return;
}

Assistant:

void to_dot() {
        auto g = new NS();

        auto p = new(g) N("p"), has = new(g) N("has instance");
        auto p1 = new(g) N("p1"), p2 = new(g) N("p2");
        auto n1 = new(g) N("A"), n2 = new(g) N("B"), n3 = new(g) N("C"), n4 = new(g) N("D");
        auto n5 = new(g) N("BA"), n6 = new(g) N("BB");
        auto n7 = new(g) N("BBB");

        p->connect(has, {p1, p2});

        n1->connect(p2, {n4});
        n1->connect(p1, {n2, n3});
        n2->connect(p1, {n5, n6});
        n6->connect(p1, {n7});
        n6->connect(p2, {n7});

        n7->connect(p1, {n2});

        std::set<N*> viewed;
        cout << "digraph T {" << endl;
        n1->histo(alg::dot(cout, viewed));
        p->histo(alg::dot(cout, viewed));
        cout << "}" << endl;

        delete g->clear();
    }